

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

parse_error *
nlohmann::detail::parse_error::create
          (parse_error *__return_storage_ptr__,int id_,position_t *pos,string *what_arg)

{
  ulong uVar1;
  size_t sVar2;
  parse_error *ppVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  long *plVar7;
  ulong uVar8;
  undefined8 uVar9;
  string w;
  long *local_118;
  undefined8 local_110;
  long local_108;
  undefined8 uStack_100;
  ulong *local_f8;
  position_t *local_f0;
  ulong local_e8;
  long lStack_e0;
  string local_d8;
  string local_b8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  parse_error *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"parse_error","");
  exception::name(&local_50,&local_b8,id_);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_e8 = *puVar6;
    lStack_e0 = plVar4[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar6;
    local_f8 = (ulong *)*plVar4;
  }
  local_f0 = (position_t *)plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  position_string_abi_cxx11_(&local_d8,(parse_error *)pos,local_f0);
  uVar1 = (long)&local_f0->chars_read_total + local_d8._M_string_length;
  uVar8 = 0xf;
  if (local_f8 != &local_e8) {
    uVar8 = local_e8;
  }
  local_78 = __return_storage_ptr__;
  if (uVar8 < uVar1) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      uVar9 = local_d8.field_2._M_allocated_capacity;
    }
    if (uVar1 <= (ulong)uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_f8);
      goto LAB_00183e9f;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d8._M_dataplus._M_p);
LAB_00183e9f:
  local_118 = &local_108;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_108 = *plVar4;
    uStack_100 = puVar5[3];
  }
  else {
    local_108 = *plVar4;
    local_118 = (long *)*puVar5;
  }
  local_110 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(what_arg->_M_dataplus)._M_p);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_88 = *plVar7;
    lStack_80 = plVar4[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar7;
    local_98 = (long *)*plVar4;
  }
  local_90 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  ppVar3 = local_78;
  sVar2 = pos->chars_read_total;
  exception::exception(&local_78->super_exception,id_,(char *)local_98);
  *(undefined ***)&ppVar3->super_exception = &PTR__exception_00370048;
  ppVar3->byte = sVar2;
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  return ppVar3;
}

Assistant:

static parse_error create(int id_, const position_t& pos, const std::string& what_arg)
    {
        std::string w = exception::name("parse_error", id_) + "parse error" +
                        position_string(pos) + ": " + what_arg;
        return parse_error(id_, pos.chars_read_total, w.c_str());
    }